

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O2

void secp256k1_testrand_bytes_test(uchar *bytes,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint uVar4;
  
  memset(bytes,0,len);
  uVar3 = 0;
  while (uVar3 < len << 3) {
    uVar1 = secp256k1_testrand64();
    uVar2 = secp256k1_testrand64();
    uVar4 = (uint)(ushort)((short)(((uint)(uVar2 >> 0x3b) * (uint)(uVar1 >> 0x3a) + 0x10) / 0x1f) +
                          1);
    uVar1 = secp256k1_testrand64();
    for (; (0 < (int)uVar4 && (uVar3 < len << 3)); uVar3 = uVar3 + 1) {
      bytes[uVar3 >> 3] = bytes[uVar3 >> 3] | (byte)(uVar1 >> 0x3f) << ((byte)uVar3 & 7);
      uVar4 = uVar4 - 1;
    }
  }
  return;
}

Assistant:

static void secp256k1_testrand_bytes_test(unsigned char *bytes, size_t len) {
    size_t bits = 0;
    memset(bytes, 0, len);
    while (bits < len * 8) {
        int now;
        uint32_t val;
        now = 1 + (secp256k1_testrand_bits(6) * secp256k1_testrand_bits(5) + 16) / 31;
        val = secp256k1_testrand_bits(1);
        while (now > 0 && bits < len * 8) {
            bytes[bits / 8] |= val << (bits % 8);
            now--;
            bits++;
        }
    }
}